

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O0

Float * __thiscall blc::math::Float::operator+(Float *this,Float *i)

{
  Float *in_RDX;
  double in_RSI;
  Float *in_RDI;
  double tmp;
  int diff;
  Float *ret;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  undefined4 local_1c;
  
  iVar1 = *(int *)((long)in_RSI + 0x10);
  local_1c = getE(in_RDX);
  local_1c = iVar1 - local_1c;
  getNb(in_RDX);
  while (local_1c != 0) {
    if (local_1c < 0) {
      local_1c = local_1c + 1;
    }
    else {
      local_1c = local_1c + -1;
    }
  }
  Float((Float *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_RSI,(int)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

blc::math::Float blc::math::Float::operator+(const blc::math::Float &i) const {
	int diff = this->_E - i.getE();
	double tmp = i.getNb();

	while (diff != 0) {
		if (diff < 0) {
			tmp *= 10;
			diff++;
		} else {
			tmp /= 10;
			diff--;
		}
	}
	blc::math::Float ret = blc::math::Float(this->_nb + tmp, this->_E);
	return (ret);
}